

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlineprops.cpp
# Opt level: O0

void test_stipples(Am_Drawonable *d)

{
  Am_Image_Array *pAVar1;
  Am_Image_Array local_40 [8];
  Am_Style local_38 [8];
  Am_Style gray_line;
  Am_Image_Array local_20 [8];
  Am_Style local_18 [8];
  Am_Style dark_gray_line;
  Am_Drawonable *d_local;
  
  _dark_gray_line = d;
  Am_Image_Array::Am_Image_Array(local_20,0x4b);
  Am_Style::Am_Style((Am_Style *)0x0,0,local_18,3,1,0,1,test_stipples::dash5_list,4,2,0,local_20);
  Am_Image_Array::~Am_Image_Array(local_20);
  Am_Image_Array::Am_Image_Array(local_40,0x32);
  pAVar1 = local_40;
  Am_Style::Am_Style((Am_Style *)0x0,0,local_38,5,1,0,1,test_stipples::dash6_list,2,2,0,pAVar1);
  Am_Image_Array::~Am_Image_Array(local_40);
  (**(code **)(*(long *)_dark_gray_line + 0x160))
            (_dark_gray_line,local_18,&Am_No_Style,10,0x140,100,0x32,0);
  (**(code **)(*(long *)_dark_gray_line + 0x130))
            (_dark_gray_line,local_38,&Am_No_Style,0x96,0x140,100,0x32,0,0x168,
             (ulong)pAVar1 & 0xffffffff00000000,1);
  Am_Style::~Am_Style(local_38);
  Am_Style::~Am_Style(local_18);
  return;
}

Assistant:

void
test_stipples(Am_Drawonable *d)
{

  static char dash5_list[4] = {20, 10, 5, 10};
  static char dash6_list[2] = {5, 20};

  Am_Style dark_gray_line(0.0f, 0.0f, 0.0f, 3, Am_CAP_BUTT, Am_JOIN_MITER,
                          Am_LINE_ON_OFF_DASH, dash5_list, 4, Am_FILL_STIPPLED,
                          Am_FILL_POLY_EVEN_ODD, Am_Image_Array(75));
  Am_Style gray_line(0.0f, 0.0f, 0.0f, 5, Am_CAP_BUTT, Am_JOIN_MITER,
                     Am_LINE_ON_OFF_DASH, dash6_list, 2, Am_FILL_STIPPLED,
                     Am_FILL_POLY_EVEN_ODD, Am_Image_Array(50));
  d->Draw_Rectangle(dark_gray_line, Am_No_Style, 10, 320, 100, 50);
  d->Draw_Arc(gray_line, Am_No_Style, 150, 320, 100, 50, 0, 360);
}